

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::SubdivPatch1MBIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  undefined4 uVar8;
  uint uVar9;
  undefined4 uVar10;
  ulong uVar11;
  GridSOA *pGVar12;
  RTCFilterFunctionN p_Var13;
  size_t sVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 (*pauVar66) [16];
  long lVar67;
  long lVar68;
  uint uVar69;
  AABBNodeMB4D *node1;
  ulong uVar70;
  uint uVar71;
  uint uVar72;
  ulong uVar73;
  ulong uVar74;
  char *pcVar75;
  ulong uVar76;
  Geometry *pGVar77;
  ulong uVar78;
  char *pcVar79;
  undefined1 (*pauVar80) [16];
  float fVar81;
  float fVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar88 [64];
  float fVar103;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar105;
  undefined1 auVar98 [32];
  float fVar104;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar110;
  float fVar111;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar112;
  float fVar121;
  float fVar123;
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar114 [16];
  float fVar127;
  float fVar129;
  float fVar131;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar128;
  float fVar130;
  float fVar132;
  float fVar133;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar141;
  float fVar142;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar154 [32];
  float fVar159;
  undefined1 auVar155 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar175;
  float fVar177;
  undefined1 auVar166 [16];
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar176;
  float fVar178;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar188;
  undefined1 auVar183 [16];
  float fVar182;
  float fVar186;
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar193;
  float fVar194;
  float fVar200;
  float fVar201;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar195 [16];
  float fVar192;
  float fVar199;
  float fVar202;
  float fVar208;
  float fVar211;
  float fVar214;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar209;
  float fVar210;
  float fVar212;
  float fVar213;
  float fVar215;
  float fVar216;
  undefined1 auVar198 [32];
  float fVar217;
  float fVar220;
  float fVar221;
  undefined1 auVar218 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar219 [32];
  float fVar226;
  float fVar229;
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  float fVar230;
  float fVar231;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar232 [16];
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar233 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1480 [8];
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined1 local_1440 [8];
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  char *local_13d8;
  ulong local_13d0;
  ulong local_13c8;
  undefined1 local_13c0 [16];
  undefined1 auStack_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 (*local_1388) [16];
  undefined8 local_1380;
  undefined1 auStack_1378 [8];
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  RTCFilterFunctionNArguments local_1350;
  undefined1 local_1320 [8];
  float fStack_1318;
  float fStack_1314;
  undefined1 auStack_1310 [8];
  float fStack_1308;
  undefined1 local_1300 [8];
  undefined8 uStack_12f8;
  undefined1 auStack_12f0 [8];
  float fStack_12e8;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [8];
  float fStack_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined1 local_1240 [32];
  char **local_1220;
  undefined1 local_1200 [32];
  float local_11e0 [4];
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined4 local_1110;
  undefined4 uStack_110c;
  undefined4 uStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float local_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined1 local_10b0 [16];
  uint local_10a0;
  uint uStack_109c;
  uint uStack_1098;
  uint uStack_1094;
  uint uStack_1090;
  uint uStack_108c;
  uint uStack_1088;
  uint uStack_1084;
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  float fStack_fc4;
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar167 [16];
  undefined1 auVar168 [24];
  undefined1 auVar171 [32];
  
  pauVar80 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar218._4_4_ = uVar3;
  auVar218._0_4_ = uVar3;
  auVar218._8_4_ = uVar3;
  auVar218._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar227._4_4_ = uVar3;
  auVar227._0_4_ = uVar3;
  auVar227._8_4_ = uVar3;
  auVar227._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar232._4_4_ = uVar3;
  auVar232._0_4_ = uVar3;
  auVar232._8_4_ = uVar3;
  auVar232._12_4_ = uVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar78 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar74 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar73 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar7 = (tray->tnear).field_0.i[k];
  auVar166._4_4_ = iVar7;
  auVar166._0_4_ = iVar7;
  auVar166._8_4_ = iVar7;
  auVar166._12_4_ = iVar7;
  iVar7 = (tray->tfar).field_0.i[k];
  auVar88 = ZEXT1664(CONCAT412(iVar7,CONCAT48(iVar7,CONCAT44(iVar7,iVar7))));
  local_1388 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
LAB_00f161b7:
  do {
    do {
      if (pauVar80 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar66 = pauVar80 + -1;
      pauVar80 = pauVar80 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar66 + 8));
    uVar76 = *(ulong *)*pauVar80;
    while ((uVar76 & 8) == 0) {
      uVar70 = uVar76 & 0xfffffffffffffff0;
      fVar82 = *(float *)(ray + k * 4 + 0x70);
      auVar94._4_4_ = fVar82;
      auVar94._0_4_ = fVar82;
      auVar94._8_4_ = fVar82;
      auVar94._12_4_ = fVar82;
      pfVar2 = (float *)(uVar70 + 0x80 + uVar78);
      pfVar1 = (float *)(uVar70 + 0x20 + uVar78);
      auVar106._0_4_ = fVar82 * *pfVar2 + *pfVar1;
      auVar106._4_4_ = fVar82 * pfVar2[1] + pfVar1[1];
      auVar106._8_4_ = fVar82 * pfVar2[2] + pfVar1[2];
      auVar106._12_4_ = fVar82 * pfVar2[3] + pfVar1[3];
      auVar106 = vsubps_avx(auVar106,auVar218);
      auVar95._0_4_ = fVar4 * auVar106._0_4_;
      auVar95._4_4_ = fVar4 * auVar106._4_4_;
      auVar95._8_4_ = fVar4 * auVar106._8_4_;
      auVar95._12_4_ = fVar4 * auVar106._12_4_;
      pfVar2 = (float *)(uVar70 + 0x80 + uVar74);
      auVar106 = vmaxps_avx(auVar166,auVar95);
      pfVar1 = (float *)(uVar70 + 0x20 + uVar74);
      auVar153._0_4_ = fVar82 * *pfVar2 + *pfVar1;
      auVar153._4_4_ = fVar82 * pfVar2[1] + pfVar1[1];
      auVar153._8_4_ = fVar82 * pfVar2[2] + pfVar1[2];
      auVar153._12_4_ = fVar82 * pfVar2[3] + pfVar1[3];
      auVar95 = vsubps_avx(auVar153,auVar227);
      pfVar2 = (float *)(uVar70 + 0x80 + uVar73);
      pfVar1 = (float *)(uVar70 + 0x20 + uVar73);
      auVar195._0_4_ = fVar82 * *pfVar2 + *pfVar1;
      auVar195._4_4_ = fVar82 * pfVar2[1] + pfVar1[1];
      auVar195._8_4_ = fVar82 * pfVar2[2] + pfVar1[2];
      auVar195._12_4_ = fVar82 * pfVar2[3] + pfVar1[3];
      auVar183._0_4_ = fVar5 * auVar95._0_4_;
      auVar183._4_4_ = fVar5 * auVar95._4_4_;
      auVar183._8_4_ = fVar5 * auVar95._8_4_;
      auVar183._12_4_ = fVar5 * auVar95._12_4_;
      auVar95 = vsubps_avx(auVar195,auVar232);
      auVar134._0_4_ = fVar6 * auVar95._0_4_;
      auVar134._4_4_ = fVar6 * auVar95._4_4_;
      auVar134._8_4_ = fVar6 * auVar95._8_4_;
      auVar134._12_4_ = fVar6 * auVar95._12_4_;
      auVar95 = vmaxps_avx(auVar183,auVar134);
      pfVar2 = (float *)(uVar70 + 0x80 + (uVar78 ^ 0x10));
      pfVar1 = (float *)(uVar70 + 0x20 + (uVar78 ^ 0x10));
      auVar135._0_4_ = fVar82 * *pfVar2 + *pfVar1;
      auVar135._4_4_ = fVar82 * pfVar2[1] + pfVar1[1];
      auVar135._8_4_ = fVar82 * pfVar2[2] + pfVar1[2];
      auVar135._12_4_ = fVar82 * pfVar2[3] + pfVar1[3];
      auVar106 = vmaxps_avx(auVar106,auVar95);
      auVar95 = vsubps_avx(auVar135,auVar218);
      auVar113._0_4_ = fVar4 * auVar95._0_4_;
      auVar113._4_4_ = fVar4 * auVar95._4_4_;
      auVar113._8_4_ = fVar4 * auVar95._8_4_;
      auVar113._12_4_ = fVar4 * auVar95._12_4_;
      auVar95 = vminps_avx(auVar88._0_16_,auVar113);
      pfVar2 = (float *)(uVar70 + 0x80 + (uVar74 ^ 0x10));
      pfVar1 = (float *)(uVar70 + 0x20 + (uVar74 ^ 0x10));
      auVar136._0_4_ = fVar82 * *pfVar2 + *pfVar1;
      auVar136._4_4_ = fVar82 * pfVar2[1] + pfVar1[1];
      auVar136._8_4_ = fVar82 * pfVar2[2] + pfVar1[2];
      auVar136._12_4_ = fVar82 * pfVar2[3] + pfVar1[3];
      auVar153 = vsubps_avx(auVar136,auVar227);
      auVar137._0_4_ = fVar5 * auVar153._0_4_;
      auVar137._4_4_ = fVar5 * auVar153._4_4_;
      auVar137._8_4_ = fVar5 * auVar153._8_4_;
      auVar137._12_4_ = fVar5 * auVar153._12_4_;
      pfVar2 = (float *)(uVar70 + 0x80 + (uVar73 ^ 0x10));
      pfVar1 = (float *)(uVar70 + 0x20 + (uVar73 ^ 0x10));
      auVar143._0_4_ = fVar82 * *pfVar2 + *pfVar1;
      auVar143._4_4_ = fVar82 * pfVar2[1] + pfVar1[1];
      auVar143._8_4_ = fVar82 * pfVar2[2] + pfVar1[2];
      auVar143._12_4_ = fVar82 * pfVar2[3] + pfVar1[3];
      auVar153 = vsubps_avx(auVar143,auVar232);
      auVar144._0_4_ = fVar6 * auVar153._0_4_;
      auVar144._4_4_ = fVar6 * auVar153._4_4_;
      auVar144._8_4_ = fVar6 * auVar153._8_4_;
      auVar144._12_4_ = fVar6 * auVar153._12_4_;
      auVar153 = vminps_avx(auVar137,auVar144);
      auVar95 = vminps_avx(auVar95,auVar153);
      if (((uint)uVar76 & 7) == 6) {
        auVar153 = vcmpps_avx(auVar106,auVar95,2);
        auVar95 = vcmpps_avx(*(undefined1 (*) [16])(uVar70 + 0xe0),auVar94,2);
        auVar94 = vcmpps_avx(auVar94,*(undefined1 (*) [16])(uVar70 + 0xf0),1);
        auVar95 = vandps_avx(auVar95,auVar94);
        auVar95 = vandps_avx(auVar95,auVar153);
      }
      else {
        auVar95 = vcmpps_avx(auVar106,auVar95,2);
      }
      auVar95 = vpslld_avx(auVar95,0x1f);
      uVar71 = vmovmskps_avx(auVar95);
      local_1280._0_16_ = auVar106;
      if (uVar71 == 0) goto LAB_00f161b7;
      uVar71 = uVar71 & 0xff;
      lVar15 = 0;
      if (uVar71 != 0) {
        for (; (uVar71 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
        }
      }
      uVar76 = *(ulong *)(uVar70 + lVar15 * 8);
      uVar71 = uVar71 - 1 & uVar71;
      if (uVar71 != 0) {
        uVar69 = *(uint *)(local_1280 + lVar15 * 4);
        lVar15 = 0;
        if (uVar71 != 0) {
          for (; (uVar71 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
        uVar11 = *(ulong *)(uVar70 + lVar15 * 8);
        uVar9 = *(uint *)(local_1280 + lVar15 * 4);
        uVar71 = uVar71 - 1 & uVar71;
        if (uVar71 == 0) {
          if (uVar69 < uVar9) {
            *(ulong *)*pauVar80 = uVar11;
            *(uint *)(*pauVar80 + 8) = uVar9;
            pauVar80 = pauVar80 + 1;
          }
          else {
            *(ulong *)*pauVar80 = uVar76;
            *(uint *)(*pauVar80 + 8) = uVar69;
            uVar76 = uVar11;
            pauVar80 = pauVar80 + 1;
          }
        }
        else {
          auVar96._8_8_ = 0;
          auVar96._0_8_ = uVar76;
          auVar106 = vpunpcklqdq_avx(auVar96,ZEXT416(uVar69));
          auVar107._8_8_ = 0;
          auVar107._0_8_ = uVar11;
          auVar95 = vpunpcklqdq_avx(auVar107,ZEXT416(uVar9));
          lVar15 = 0;
          if (uVar71 != 0) {
            for (; (uVar71 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
            }
          }
          auVar114._8_8_ = 0;
          auVar114._0_8_ = *(ulong *)(uVar70 + lVar15 * 8);
          auVar94 = vpunpcklqdq_avx(auVar114,ZEXT416(*(uint *)(local_1280 + lVar15 * 4)));
          auVar153 = vpcmpgtd_avx(auVar95,auVar106);
          uVar71 = uVar71 - 1 & uVar71;
          if (uVar71 == 0) {
            auVar183 = vpshufd_avx(auVar153,0xaa);
            auVar153 = vblendvps_avx(auVar95,auVar106,auVar183);
            auVar106 = vblendvps_avx(auVar106,auVar95,auVar183);
            auVar95 = vpcmpgtd_avx(auVar94,auVar153);
            auVar183 = vpshufd_avx(auVar95,0xaa);
            auVar95 = vblendvps_avx(auVar94,auVar153,auVar183);
            auVar153 = vblendvps_avx(auVar153,auVar94,auVar183);
            auVar94 = vpcmpgtd_avx(auVar153,auVar106);
            auVar183 = vpshufd_avx(auVar94,0xaa);
            auVar94 = vblendvps_avx(auVar153,auVar106,auVar183);
            auVar106 = vblendvps_avx(auVar106,auVar153,auVar183);
            *pauVar80 = auVar106;
            pauVar80[1] = auVar94;
            uVar76 = auVar95._0_8_;
            pauVar80 = pauVar80 + 2;
          }
          else {
            lVar15 = 0;
            if (uVar71 != 0) {
              for (; (uVar71 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
              }
            }
            auVar145._8_8_ = 0;
            auVar145._0_8_ = *(ulong *)(uVar70 + lVar15 * 8);
            auVar113 = vpunpcklqdq_avx(auVar145,ZEXT416(*(uint *)(local_1280 + lVar15 * 4)));
            auVar183 = vpshufd_avx(auVar153,0xaa);
            auVar153 = vblendvps_avx(auVar95,auVar106,auVar183);
            auVar106 = vblendvps_avx(auVar106,auVar95,auVar183);
            auVar95 = vpcmpgtd_avx(auVar113,auVar94);
            auVar183 = vpshufd_avx(auVar95,0xaa);
            auVar95 = vblendvps_avx(auVar113,auVar94,auVar183);
            auVar94 = vblendvps_avx(auVar94,auVar113,auVar183);
            auVar183 = vpcmpgtd_avx(auVar94,auVar106);
            auVar113 = vpshufd_avx(auVar183,0xaa);
            auVar183 = vblendvps_avx(auVar94,auVar106,auVar113);
            auVar106 = vblendvps_avx(auVar106,auVar94,auVar113);
            auVar94 = vpcmpgtd_avx(auVar95,auVar153);
            auVar113 = vpshufd_avx(auVar94,0xaa);
            auVar94 = vblendvps_avx(auVar95,auVar153,auVar113);
            auVar95 = vblendvps_avx(auVar153,auVar95,auVar113);
            auVar153 = vpcmpgtd_avx(auVar183,auVar95);
            auVar113 = vpshufd_avx(auVar153,0xaa);
            auVar153 = vblendvps_avx(auVar183,auVar95,auVar113);
            auVar95 = vblendvps_avx(auVar95,auVar183,auVar113);
            *pauVar80 = auVar106;
            pauVar80[1] = auVar95;
            pauVar80[2] = auVar153;
            uVar76 = auVar94._0_8_;
            pauVar80 = pauVar80 + 3;
          }
        }
      }
    }
    if (((uint)uVar76 & 0xf) == 8) {
      pGVar12 = (pre->super_Precalculations).grid;
      fVar81 = (float)(pGVar12->time_steps - 1);
      fVar82 = fVar81 * *(float *)(ray + k * 4 + 0x70);
      uVar71 = pGVar12->width;
      local_13d0 = (ulong)uVar71;
      auVar106 = vroundss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82),9);
      auVar106 = vminss_avx(auVar106,ZEXT416((uint)(fVar81 + -1.0)));
      auVar153 = vmaxss_avx(ZEXT816(0) << 0x20,auVar106);
      uVar69 = pGVar12->height;
      local_13c8 = (ulong)uVar69;
      lVar15 = (long)(int)auVar153._0_4_ * (ulong)pGVar12->gridBytes + (ulong)pGVar12->gridOffset;
      uVar76 = uVar76 >> 4;
      lVar67 = uVar76 * 4 + lVar15;
      lVar68 = uVar76 * 4 + lVar15 + 0x2c;
      auVar106 = *(undefined1 (*) [16])(pGVar12->data + local_13d0 * 4 + lVar67 + -4);
      auVar95 = auVar106;
      if (2 < local_13c8) {
        auVar95 = *(undefined1 (*) [16])(pGVar12->data + local_13d0 * 8 + lVar68 + -0x30);
      }
      _local_1440 = *(undefined1 (*) [16])(pGVar12->data + uVar76 * 4 + lVar15 + -4);
      if (local_13d0 == 2) {
        _local_1440 = vshufps_avx(_local_1440,_local_1440,0x54);
        auVar106 = vshufps_avx(auVar106,auVar106,0x54);
        auVar95 = vshufps_avx(auVar95,auVar95,0x54);
      }
      uVar76 = (ulong)pGVar12->dim_offset;
      pcVar75 = pGVar12->data + uVar76 * 4 + lVar67 + -4;
      auVar94 = *(undefined1 (*) [16])(pcVar75 + local_13d0 * 4);
      auVar183 = auVar94;
      if (2 < uVar69) {
        auVar183 = *(undefined1 (*) [16])(pcVar75 + local_13d0 * 8);
      }
      _local_1480 = *(undefined1 (*) [16])pcVar75;
      if (uVar71 == 2) {
        _local_1480 = vshufps_avx(_local_1480,_local_1480,0x54);
        auVar94 = vshufps_avx(auVar94,auVar94,0x54);
        auVar183 = vshufps_avx(auVar183,auVar183,0x54);
      }
      pcVar79 = pGVar12->data + uVar76 * 8 + lVar67 + -4;
      auVar113 = *(undefined1 (*) [16])(pcVar79 + local_13d0 * 4);
      auVar195 = auVar113;
      if (2 < uVar69) {
        auVar195 = *(undefined1 (*) [16])(pcVar79 + local_13d0 * 8);
      }
      auVar134 = *(undefined1 (*) [16])pcVar79;
      if (uVar71 == 2) {
        auVar134 = vshufps_avx(auVar134,auVar134,0x54);
        auVar113 = vshufps_avx(auVar113,auVar113,0x54);
        auVar195 = vshufps_avx(auVar195,auVar195,0x54);
      }
      uVar70 = (ulong)(pGVar12->gridBytes & 0xfffffffc);
      auVar135 = *(undefined1 (*) [16])(pGVar12->data + local_13d0 * 4 + uVar70 + lVar68 + -0x30);
      auVar136 = auVar135;
      if (2 < uVar69) {
        auVar136 = *(undefined1 (*) [16])(pGVar12->data + local_13d0 * 8 + uVar70 + lVar68 + -0x30);
      }
      auVar137 = *(undefined1 (*) [16])(pGVar12->data + uVar70 + lVar68 + -0x30);
      if (uVar71 == 2) {
        auVar137 = vshufps_avx(auVar137,auVar137,0x54);
        auVar135 = vshufps_avx(auVar135,auVar135,0x54);
        auVar136 = vshufps_avx(auVar136,auVar136,0x54);
      }
      pcVar75 = pcVar75 + uVar70;
      auVar143 = *(undefined1 (*) [16])(pcVar75 + local_13d0 * 4);
      auVar144 = auVar143;
      if (2 < uVar69) {
        auVar144 = *(undefined1 (*) [16])(pcVar75 + local_13d0 * 8);
      }
      auVar96 = *(undefined1 (*) [16])pcVar75;
      if (uVar71 == 2) {
        auVar96 = vshufps_avx(auVar96,auVar96,0x54);
        auVar143 = vshufps_avx(auVar143,auVar143,0x54);
        auVar144 = vshufps_avx(auVar144,auVar144,0x54);
      }
      pcVar79 = pcVar79 + uVar70;
      auVar107 = *(undefined1 (*) [16])pcVar79;
      auVar114 = *(undefined1 (*) [16])(pcVar79 + local_13d0 * 4);
      auVar145 = auVar114;
      if (2 < uVar69) {
        auVar145 = *(undefined1 (*) [16])(pcVar79 + local_13d0 * 8);
      }
      fVar82 = fVar82 - auVar153._0_4_;
      auVar138._16_16_ = auVar106;
      auVar138._0_16_ = _local_1440;
      auVar108._16_16_ = auVar95;
      auVar108._0_16_ = auVar106;
      auVar30 = vunpcklps_avx(auVar138,auVar108);
      auVar138 = vshufps_avx(auVar138,auVar138,0xa5);
      auVar108 = vshufps_avx(auVar108,auVar108,0x94);
      auVar116._16_16_ = auVar94;
      auVar116._0_16_ = _local_1480;
      auVar146._16_16_ = auVar183;
      auVar146._0_16_ = auVar94;
      auVar31 = vunpcklps_avx(auVar116,auVar146);
      auVar116 = vshufps_avx(auVar116,auVar116,0xa5);
      auVar146 = vshufps_avx(auVar146,auVar146,0x94);
      auVar117._16_16_ = auVar113;
      auVar117._0_16_ = auVar134;
      auVar148._16_16_ = auVar195;
      auVar148._0_16_ = auVar113;
      auVar32 = vunpcklps_avx(auVar117,auVar148);
      auVar117 = vshufps_avx(auVar117,auVar117,0xa5);
      auVar148 = vshufps_avx(auVar148,auVar148,0x94);
      auVar149._16_16_ = auVar135;
      auVar149._0_16_ = auVar137;
      auVar196._16_16_ = auVar136;
      auVar196._0_16_ = auVar135;
      auVar33 = vunpcklps_avx(auVar149,auVar196);
      auVar149 = vshufps_avx(auVar149,auVar149,0xa5);
      auVar196 = vshufps_avx(auVar196,auVar196,0x94);
      auVar169._16_16_ = auVar143;
      auVar169._0_16_ = auVar96;
      auVar246._16_16_ = auVar144;
      auVar246._0_16_ = auVar143;
      auVar34 = vunpcklps_avx(auVar169,auVar246);
      auVar169 = vshufps_avx(auVar169,auVar169,0xa5);
      auVar246 = vshufps_avx(auVar246,auVar246,0x94);
      if (uVar71 == 2) {
        auVar107 = vshufps_avx(auVar107,auVar107,0x54);
        auVar114 = vshufps_avx(auVar114,auVar114,0x54);
        auVar145 = vshufps_avx(auVar145,auVar145,0x54);
      }
      auVar247._16_16_ = auVar114;
      auVar247._0_16_ = auVar107;
      auVar139._16_16_ = auVar145;
      auVar139._0_16_ = auVar114;
      auVar106 = vshufps_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82),0);
      auVar95 = vshufps_avx(ZEXT416((uint)(1.0 - fVar82)),ZEXT416((uint)(1.0 - fVar82)),0);
      fVar226 = auVar106._0_4_;
      fVar229 = auVar106._4_4_;
      fVar122 = auVar106._8_4_;
      fVar124 = auVar106._12_4_;
      local_12c0._0_4_ = auVar30._0_4_;
      local_12c0._4_4_ = auVar30._4_4_;
      fStack_12b8 = auVar30._8_4_;
      fStack_12b4 = auVar30._12_4_;
      fStack_12b0 = auVar30._16_4_;
      fStack_12ac = auVar30._20_4_;
      fStack_12a8 = auVar30._24_4_;
      fVar81 = auVar95._0_4_;
      fVar156 = auVar95._4_4_;
      fVar157 = auVar95._8_4_;
      fVar158 = auVar95._12_4_;
      auVar83._0_4_ = fVar81 * (float)local_12c0._0_4_ + fVar226 * auVar33._0_4_;
      auVar83._4_4_ = fVar156 * (float)local_12c0._4_4_ + fVar229 * auVar33._4_4_;
      auVar83._8_4_ = fVar157 * fStack_12b8 + fVar122 * auVar33._8_4_;
      auVar83._12_4_ = fVar158 * fStack_12b4 + fVar124 * auVar33._12_4_;
      auVar83._16_4_ = fVar81 * fStack_12b0 + fVar226 * auVar33._16_4_;
      auVar83._20_4_ = fVar156 * fStack_12ac + fVar229 * auVar33._20_4_;
      auVar83._24_4_ = fVar157 * fStack_12a8 + fVar122 * auVar33._24_4_;
      auVar83._28_4_ = 0;
      auVar84._0_4_ = fVar81 * auVar31._0_4_ + fVar226 * auVar34._0_4_;
      auVar84._4_4_ = fVar156 * auVar31._4_4_ + fVar229 * auVar34._4_4_;
      auVar84._8_4_ = fVar157 * auVar31._8_4_ + fVar122 * auVar34._8_4_;
      auVar84._12_4_ = fVar158 * auVar31._12_4_ + fVar124 * auVar34._12_4_;
      auVar84._16_4_ = fVar81 * auVar31._16_4_ + fVar226 * auVar34._16_4_;
      auVar84._20_4_ = fVar156 * auVar31._20_4_ + fVar229 * auVar34._20_4_;
      auVar84._24_4_ = fVar157 * auVar31._24_4_ + fVar122 * auVar34._24_4_;
      auVar84._28_4_ = auVar31._28_4_ + 0.0;
      auVar30 = vunpcklps_avx(auVar247,auVar139);
      auVar98._0_4_ = auVar32._0_4_ * fVar81 + fVar226 * auVar30._0_4_;
      auVar98._4_4_ = auVar32._4_4_ * fVar156 + fVar229 * auVar30._4_4_;
      auVar98._8_4_ = auVar32._8_4_ * fVar157 + fVar122 * auVar30._8_4_;
      auVar98._12_4_ = auVar32._12_4_ * fVar158 + fVar124 * auVar30._12_4_;
      auVar98._16_4_ = auVar32._16_4_ * fVar81 + fVar226 * auVar30._16_4_;
      auVar98._20_4_ = auVar32._20_4_ * fVar156 + fVar229 * auVar30._20_4_;
      auVar98._24_4_ = auVar32._24_4_ * fVar157 + fVar122 * auVar30._24_4_;
      auVar98._28_4_ = auVar33._28_4_ + auVar30._28_4_;
      local_1380._0_4_ = auVar138._0_4_;
      local_1380._4_4_ = auVar138._4_4_;
      auStack_1378._0_4_ = auVar138._8_4_;
      auStack_1378._4_4_ = auVar138._12_4_;
      fStack_1370 = auVar138._16_4_;
      fStack_136c = auVar138._20_4_;
      fStack_1368 = auVar138._24_4_;
      auVar160._0_4_ = fVar81 * (float)local_1380 + fVar226 * auVar149._0_4_;
      auVar160._4_4_ = fVar156 * local_1380._4_4_ + fVar229 * auVar149._4_4_;
      auVar160._8_4_ = fVar157 * (float)auStack_1378._0_4_ + fVar122 * auVar149._8_4_;
      auVar160._12_4_ = fVar158 * (float)auStack_1378._4_4_ + fVar124 * auVar149._12_4_;
      auVar160._16_4_ = fVar81 * fStack_1370 + fVar226 * auVar149._16_4_;
      auVar160._20_4_ = fVar156 * fStack_136c + fVar229 * auVar149._20_4_;
      auVar160._24_4_ = fVar157 * fStack_1368 + fVar122 * auVar149._24_4_;
      auVar160._28_4_ = auVar32._28_4_ + auVar33._28_4_;
      local_13d8 = pGVar12->data + uVar76 * 0xc + lVar67 + -4;
      auVar138 = vshufps_avx(auVar247,auVar247,0xa5);
      auVar30 = vshufps_avx(auVar139,auVar139,0x94);
      fVar82 = auVar138._28_4_;
      local_1320._0_4_ = auVar116._0_4_;
      local_1320._4_4_ = auVar116._4_4_;
      fStack_1318 = auVar116._8_4_;
      fStack_1314 = auVar116._12_4_;
      auStack_1310._0_4_ = auVar116._16_4_;
      auStack_1310._4_4_ = auVar116._20_4_;
      fStack_1308 = auVar116._24_4_;
      auVar184._0_4_ = fVar81 * (float)local_1320._0_4_ + fVar226 * auVar169._0_4_;
      auVar184._4_4_ = fVar156 * (float)local_1320._4_4_ + fVar229 * auVar169._4_4_;
      auVar184._8_4_ = fVar157 * fStack_1318 + fVar122 * auVar169._8_4_;
      auVar184._12_4_ = fVar158 * fStack_1314 + fVar124 * auVar169._12_4_;
      auVar184._16_4_ = fVar81 * (float)auStack_1310._0_4_ + fVar226 * auVar169._16_4_;
      auVar184._20_4_ = fVar156 * (float)auStack_1310._4_4_ + fVar229 * auVar169._20_4_;
      auVar184._24_4_ = fVar157 * fStack_1308 + fVar122 * auVar169._24_4_;
      auVar184._28_4_ = auVar169._28_4_ + auVar149._28_4_;
      auVar197._0_4_ = fVar81 * auVar117._0_4_ + fVar226 * auVar138._0_4_;
      auVar197._4_4_ = fVar156 * auVar117._4_4_ + fVar229 * auVar138._4_4_;
      auVar197._8_4_ = fVar157 * auVar117._8_4_ + fVar122 * auVar138._8_4_;
      auVar197._12_4_ = fVar158 * auVar117._12_4_ + fVar124 * auVar138._12_4_;
      auVar197._16_4_ = fVar81 * auVar117._16_4_ + fVar226 * auVar138._16_4_;
      auVar197._20_4_ = fVar156 * auVar117._20_4_ + fVar229 * auVar138._20_4_;
      auVar197._24_4_ = fVar157 * auVar117._24_4_ + fVar122 * auVar138._24_4_;
      auVar197._28_4_ = auVar117._28_4_ + fVar82;
      local_1440._0_4_ = auVar108._0_4_;
      local_1440._4_4_ = auVar108._4_4_;
      fStack_1438 = auVar108._8_4_;
      fStack_1434 = auVar108._12_4_;
      fStack_1430 = auVar108._16_4_;
      fStack_142c = auVar108._20_4_;
      fStack_1428 = auVar108._24_4_;
      auVar170._0_4_ = fVar81 * (float)local_1440._0_4_ + fVar226 * auVar196._0_4_;
      auVar170._4_4_ = fVar156 * (float)local_1440._4_4_ + fVar229 * auVar196._4_4_;
      auVar170._8_4_ = fVar157 * fStack_1438 + fVar122 * auVar196._8_4_;
      auVar170._12_4_ = fVar158 * fStack_1434 + fVar124 * auVar196._12_4_;
      auVar170._16_4_ = fVar81 * fStack_1430 + fVar226 * auVar196._16_4_;
      auVar170._20_4_ = fVar156 * fStack_142c + fVar229 * auVar196._20_4_;
      auVar170._24_4_ = fVar157 * fStack_1428 + fVar122 * auVar196._24_4_;
      auVar170._28_4_ = auVar196._28_4_ + fVar82;
      local_1480._0_4_ = auVar146._0_4_;
      local_1480._4_4_ = auVar146._4_4_;
      uStack_1478._0_4_ = auVar146._8_4_;
      uStack_1478._4_4_ = auVar146._12_4_;
      uStack_1470._0_4_ = auVar146._16_4_;
      uStack_1470._4_4_ = auVar146._20_4_;
      uStack_1468._0_4_ = auVar146._24_4_;
      auVar219._0_4_ = fVar81 * (float)local_1480._0_4_ + fVar226 * auVar246._0_4_;
      auVar219._4_4_ = fVar156 * (float)local_1480._4_4_ + fVar229 * auVar246._4_4_;
      auVar219._8_4_ = fVar157 * (float)uStack_1478 + fVar122 * auVar246._8_4_;
      auVar219._12_4_ = fVar158 * uStack_1478._4_4_ + fVar124 * auVar246._12_4_;
      auVar219._16_4_ = fVar81 * (float)uStack_1470 + fVar226 * auVar246._16_4_;
      auVar219._20_4_ = fVar156 * uStack_1470._4_4_ + fVar229 * auVar246._20_4_;
      auVar219._24_4_ = fVar157 * (float)uStack_1468 + fVar122 * auVar246._24_4_;
      auVar219._28_4_ = fVar82 + auVar117._28_4_;
      local_1300._0_4_ = auVar148._0_4_;
      local_1300._4_4_ = auVar148._4_4_;
      uStack_12f8._0_4_ = auVar148._8_4_;
      uStack_12f8._4_4_ = auVar148._12_4_;
      auStack_12f0._0_4_ = auVar148._16_4_;
      auStack_12f0._4_4_ = auVar148._20_4_;
      fStack_12e8 = auVar148._24_4_;
      uVar3 = *(undefined4 *)(ray + k * 4);
      auVar154._4_4_ = uVar3;
      auVar154._0_4_ = uVar3;
      auVar154._8_4_ = uVar3;
      auVar154._12_4_ = uVar3;
      auVar154._16_4_ = uVar3;
      auVar154._20_4_ = uVar3;
      auVar154._24_4_ = uVar3;
      auVar154._28_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar228._4_4_ = uVar3;
      auVar228._0_4_ = uVar3;
      auVar228._8_4_ = uVar3;
      auVar228._12_4_ = uVar3;
      auVar228._16_4_ = uVar3;
      auVar228._20_4_ = uVar3;
      auVar228._24_4_ = uVar3;
      auVar228._28_4_ = uVar3;
      auVar233._0_4_ = fVar81 * (float)local_1300._0_4_ + fVar226 * auVar30._0_4_;
      auVar233._4_4_ = fVar156 * (float)local_1300._4_4_ + fVar229 * auVar30._4_4_;
      auVar233._8_4_ = fVar157 * (float)uStack_12f8 + fVar122 * auVar30._8_4_;
      auVar233._12_4_ = fVar158 * uStack_12f8._4_4_ + fVar124 * auVar30._12_4_;
      auVar233._16_4_ = fVar81 * (float)auStack_12f0._0_4_ + fVar226 * auVar30._16_4_;
      auVar233._20_4_ = fVar156 * (float)auStack_12f0._4_4_ + fVar229 * auVar30._20_4_;
      auVar233._24_4_ = fVar157 * fStack_12e8 + fVar122 * auVar30._24_4_;
      auVar233._28_4_ = fVar82 + auVar30._28_4_;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar248._4_4_ = uVar3;
      auVar248._0_4_ = uVar3;
      auVar248._8_4_ = uVar3;
      auVar248._12_4_ = uVar3;
      auVar248._16_4_ = uVar3;
      auVar248._20_4_ = uVar3;
      auVar248._24_4_ = uVar3;
      auVar248._28_4_ = uVar3;
      auVar146 = vsubps_avx(auVar83,auVar154);
      auVar117 = vsubps_avx(auVar84,auVar228);
      auVar148 = vsubps_avx(auVar98,auVar248);
      auVar149 = vsubps_avx(auVar160,auVar154);
      auVar138 = vsubps_avx(auVar184,auVar228);
      auVar108 = vsubps_avx(auVar197,auVar248);
      auVar116 = vsubps_avx(auVar170,auVar154);
      auVar196 = vsubps_avx(auVar219,auVar228);
      auVar169 = vsubps_avx(auVar233,auVar248);
      _local_12c0 = vsubps_avx(auVar116,auVar146);
      local_12e0 = vsubps_avx(auVar196,auVar117);
      local_fc0 = vsubps_avx(auVar169,auVar148);
      fVar156 = auVar117._0_4_;
      fVar82 = auVar196._0_4_ + fVar156;
      fVar226 = auVar117._4_4_;
      fVar81 = auVar196._4_4_ + fVar226;
      fVar124 = auVar117._8_4_;
      fVar89 = auVar196._8_4_ + fVar124;
      fVar130 = auVar117._12_4_;
      fVar90 = auVar196._12_4_ + fVar130;
      fVar17 = auVar117._16_4_;
      fVar91 = auVar196._16_4_ + fVar17;
      fVar20 = auVar117._20_4_;
      fVar92 = auVar196._20_4_ + fVar20;
      fVar23 = auVar117._24_4_;
      fVar93 = auVar196._24_4_ + fVar23;
      fVar157 = auVar148._0_4_;
      fVar163 = auVar169._0_4_ + fVar157;
      fVar229 = auVar148._4_4_;
      fVar175 = auVar169._4_4_ + fVar229;
      fVar126 = auVar148._8_4_;
      fVar177 = auVar169._8_4_ + fVar126;
      fVar132 = auVar148._12_4_;
      fVar178 = auVar169._12_4_ + fVar132;
      fVar18 = auVar148._16_4_;
      fVar179 = auVar169._16_4_ + fVar18;
      fVar21 = auVar148._20_4_;
      fVar180 = auVar169._20_4_ + fVar21;
      fVar24 = auVar148._24_4_;
      fVar181 = auVar169._24_4_ + fVar24;
      fVar164 = auVar148._28_4_;
      fVar103 = local_fc0._0_4_;
      fVar104 = local_fc0._4_4_;
      auVar30._4_4_ = fVar81 * fVar104;
      auVar30._0_4_ = fVar82 * fVar103;
      fVar105 = local_fc0._8_4_;
      auVar30._8_4_ = fVar89 * fVar105;
      fVar26 = local_fc0._12_4_;
      auVar30._12_4_ = fVar90 * fVar26;
      fVar27 = local_fc0._16_4_;
      auVar30._16_4_ = fVar91 * fVar27;
      fVar28 = local_fc0._20_4_;
      auVar30._20_4_ = fVar92 * fVar28;
      fVar29 = local_fc0._24_4_;
      auVar30._24_4_ = fVar93 * fVar29;
      auVar30._28_4_ = auVar184._28_4_;
      fVar230 = local_12e0._0_4_;
      fVar234 = local_12e0._4_4_;
      auVar31._4_4_ = fVar234 * fVar175;
      auVar31._0_4_ = fVar230 * fVar163;
      fVar236 = local_12e0._8_4_;
      auVar31._8_4_ = fVar236 * fVar177;
      fVar238 = local_12e0._12_4_;
      auVar31._12_4_ = fVar238 * fVar178;
      fVar240 = local_12e0._16_4_;
      auVar31._16_4_ = fVar240 * fVar179;
      fVar242 = local_12e0._20_4_;
      auVar31._20_4_ = fVar242 * fVar180;
      fVar244 = local_12e0._24_4_;
      auVar31._24_4_ = fVar244 * fVar181;
      auVar31._28_4_ = auVar219._28_4_;
      auVar246 = vsubps_avx(auVar31,auVar30);
      fVar158 = auVar146._0_4_;
      fVar182 = auVar116._0_4_ + fVar158;
      fVar122 = auVar146._4_4_;
      fVar186 = auVar116._4_4_ + fVar122;
      fVar128 = auVar146._8_4_;
      fVar187 = auVar116._8_4_ + fVar128;
      fVar16 = auVar146._12_4_;
      fVar188 = auVar116._12_4_ + fVar16;
      fVar19 = auVar146._16_4_;
      fVar189 = auVar116._16_4_ + fVar19;
      fVar22 = auVar146._20_4_;
      fVar190 = auVar116._20_4_ + fVar22;
      fVar25 = auVar146._24_4_;
      fVar191 = auVar116._24_4_ + fVar25;
      fVar159 = auVar116._28_4_;
      fVar192 = local_12c0._0_4_;
      fVar199 = local_12c0._4_4_;
      auVar32._4_4_ = fVar199 * fVar175;
      auVar32._0_4_ = fVar192 * fVar163;
      fVar202 = local_12c0._8_4_;
      auVar32._8_4_ = fVar202 * fVar177;
      fVar205 = local_12c0._12_4_;
      auVar32._12_4_ = fVar205 * fVar178;
      fVar208 = local_12c0._16_4_;
      auVar32._16_4_ = fVar208 * fVar179;
      fVar211 = local_12c0._20_4_;
      auVar32._20_4_ = fVar211 * fVar180;
      fVar214 = local_12c0._24_4_;
      auVar32._24_4_ = fVar214 * fVar181;
      auVar32._28_4_ = auVar169._28_4_ + fVar164;
      auVar83 = local_fc0;
      auVar33._4_4_ = fVar186 * fVar104;
      auVar33._0_4_ = fVar182 * fVar103;
      auVar33._8_4_ = fVar187 * fVar105;
      auVar33._12_4_ = fVar188 * fVar26;
      auVar33._16_4_ = fVar189 * fVar27;
      auVar33._20_4_ = fVar190 * fVar28;
      auVar33._24_4_ = fVar191 * fVar29;
      auVar33._28_4_ = auVar219._28_4_;
      auVar30 = vsubps_avx(auVar33,auVar32);
      auVar34._4_4_ = fVar186 * fVar234;
      auVar34._0_4_ = fVar182 * fVar230;
      auVar34._8_4_ = fVar187 * fVar236;
      auVar34._12_4_ = fVar188 * fVar238;
      auVar34._16_4_ = fVar189 * fVar240;
      auVar34._20_4_ = fVar190 * fVar242;
      auVar34._24_4_ = fVar191 * fVar244;
      auVar34._28_4_ = fVar159 + auVar146._28_4_;
      auVar35._4_4_ = fVar199 * fVar81;
      auVar35._0_4_ = fVar192 * fVar82;
      auVar35._8_4_ = fVar202 * fVar89;
      auVar35._12_4_ = fVar205 * fVar90;
      auVar35._16_4_ = fVar208 * fVar91;
      auVar35._20_4_ = fVar211 * fVar92;
      auVar35._24_4_ = fVar214 * fVar93;
      auVar35._28_4_ = auVar196._28_4_ + auVar117._28_4_;
      fVar82 = *(float *)(ray + k * 4 + 0x60);
      auVar31 = vsubps_avx(auVar35,auVar34);
      local_fe0 = *(float *)(ray + k * 4 + 0x50);
      fVar81 = *(float *)(ray + k * 4 + 0x40);
      local_1040._0_4_ =
           auVar246._0_4_ * fVar81 + local_fe0 * auVar30._0_4_ + auVar31._0_4_ * fVar82;
      local_1040._4_4_ =
           auVar246._4_4_ * fVar81 + local_fe0 * auVar30._4_4_ + auVar31._4_4_ * fVar82;
      local_1040._8_4_ =
           auVar246._8_4_ * fVar81 + local_fe0 * auVar30._8_4_ + auVar31._8_4_ * fVar82;
      local_1040._12_4_ =
           auVar246._12_4_ * fVar81 + local_fe0 * auVar30._12_4_ + auVar31._12_4_ * fVar82;
      local_1040._16_4_ =
           auVar246._16_4_ * fVar81 + local_fe0 * auVar30._16_4_ + auVar31._16_4_ * fVar82;
      local_1040._20_4_ =
           auVar246._20_4_ * fVar81 + local_fe0 * auVar30._20_4_ + auVar31._20_4_ * fVar82;
      local_1040._24_4_ =
           auVar246._24_4_ * fVar81 + local_fe0 * auVar30._24_4_ + auVar31._24_4_ * fVar82;
      local_1040._28_4_ = auVar246._28_4_ + auVar30._28_4_ + auVar31._28_4_;
      local_1000 = vsubps_avx(auVar117,auVar138);
      local_1020 = vsubps_avx(auVar148,auVar108);
      fVar90 = auVar138._0_4_ + fVar156;
      fVar91 = auVar138._4_4_ + fVar226;
      fVar92 = auVar138._8_4_ + fVar124;
      fVar93 = auVar138._12_4_ + fVar130;
      fVar163 = auVar138._16_4_ + fVar17;
      fVar175 = auVar138._20_4_ + fVar20;
      fVar177 = auVar138._24_4_ + fVar23;
      fVar178 = fVar157 + auVar108._0_4_;
      fVar179 = fVar229 + auVar108._4_4_;
      fVar180 = fVar126 + auVar108._8_4_;
      fVar181 = fVar132 + auVar108._12_4_;
      fVar182 = fVar18 + auVar108._16_4_;
      fVar186 = fVar21 + auVar108._20_4_;
      fVar187 = fVar24 + auVar108._24_4_;
      fVar89 = auVar108._28_4_;
      fVar193 = local_1020._0_4_;
      fVar200 = local_1020._4_4_;
      auVar36._4_4_ = fVar200 * fVar91;
      auVar36._0_4_ = fVar193 * fVar90;
      fVar203 = local_1020._8_4_;
      auVar36._8_4_ = fVar203 * fVar92;
      fVar206 = local_1020._12_4_;
      auVar36._12_4_ = fVar206 * fVar93;
      fVar209 = local_1020._16_4_;
      auVar36._16_4_ = fVar209 * fVar163;
      fVar212 = local_1020._20_4_;
      auVar36._20_4_ = fVar212 * fVar175;
      fVar215 = local_1020._24_4_;
      auVar36._24_4_ = fVar215 * fVar177;
      auVar36._28_4_ = local_12e0._28_4_;
      fVar217 = local_1000._0_4_;
      fVar220 = local_1000._4_4_;
      auVar37._4_4_ = fVar220 * fVar179;
      auVar37._0_4_ = fVar217 * fVar178;
      fVar221 = local_1000._8_4_;
      auVar37._8_4_ = fVar221 * fVar180;
      fVar222 = local_1000._12_4_;
      auVar37._12_4_ = fVar222 * fVar181;
      fVar223 = local_1000._16_4_;
      auVar37._16_4_ = fVar223 * fVar182;
      fVar224 = local_1000._20_4_;
      auVar37._20_4_ = fVar224 * fVar186;
      fVar225 = local_1000._24_4_;
      auVar37._24_4_ = fVar225 * fVar187;
      auVar37._28_4_ = fVar164;
      auVar246 = vsubps_avx(auVar37,auVar36);
      auVar30 = vsubps_avx(auVar146,auVar149);
      fVar231 = auVar30._0_4_;
      fVar235 = auVar30._4_4_;
      auVar38._4_4_ = fVar235 * fVar179;
      auVar38._0_4_ = fVar231 * fVar178;
      fVar237 = auVar30._8_4_;
      auVar38._8_4_ = fVar237 * fVar180;
      fVar239 = auVar30._12_4_;
      auVar38._12_4_ = fVar239 * fVar181;
      fVar241 = auVar30._16_4_;
      auVar38._16_4_ = fVar241 * fVar182;
      fVar243 = auVar30._20_4_;
      auVar38._20_4_ = fVar243 * fVar186;
      fVar245 = auVar30._24_4_;
      auVar38._24_4_ = fVar245 * fVar187;
      auVar38._28_4_ = fVar164 + fVar89;
      fVar164 = fVar158 + auVar149._0_4_;
      fVar178 = fVar122 + auVar149._4_4_;
      fVar179 = fVar128 + auVar149._8_4_;
      fVar180 = fVar16 + auVar149._12_4_;
      fVar181 = fVar19 + auVar149._16_4_;
      fVar182 = fVar22 + auVar149._20_4_;
      fVar186 = fVar25 + auVar149._24_4_;
      auVar39._4_4_ = fVar178 * fVar200;
      auVar39._0_4_ = fVar164 * fVar193;
      auVar39._8_4_ = fVar179 * fVar203;
      auVar39._12_4_ = fVar180 * fVar206;
      auVar39._16_4_ = fVar181 * fVar209;
      auVar39._20_4_ = fVar182 * fVar212;
      auVar39._24_4_ = fVar186 * fVar215;
      auVar39._28_4_ = local_1020._28_4_;
      auVar30 = vsubps_avx(auVar39,auVar38);
      auVar40._4_4_ = fVar178 * fVar220;
      auVar40._0_4_ = fVar164 * fVar217;
      auVar40._8_4_ = fVar179 * fVar221;
      auVar40._12_4_ = fVar180 * fVar222;
      auVar40._16_4_ = fVar181 * fVar223;
      auVar40._20_4_ = fVar182 * fVar224;
      auVar40._24_4_ = fVar186 * fVar225;
      auVar40._28_4_ = auVar146._28_4_ + auVar149._28_4_;
      auVar41._4_4_ = fVar235 * fVar91;
      auVar41._0_4_ = fVar231 * fVar90;
      auVar41._8_4_ = fVar237 * fVar92;
      auVar41._12_4_ = fVar239 * fVar93;
      auVar41._16_4_ = fVar241 * fVar163;
      auVar41._20_4_ = fVar243 * fVar175;
      auVar41._24_4_ = fVar245 * fVar177;
      auVar41._28_4_ = auVar138._28_4_ + auVar117._28_4_;
      auVar31 = vsubps_avx(auVar41,auVar40);
      fVar165 = fVar81 * auVar246._0_4_ + auVar31._0_4_ * fVar82 + local_fe0 * auVar30._0_4_;
      fVar176 = fVar81 * auVar246._4_4_ + auVar31._4_4_ * fVar82 + local_fe0 * auVar30._4_4_;
      auVar167._0_8_ = CONCAT44(fVar176,fVar165);
      auVar167._8_4_ = fVar81 * auVar246._8_4_ + auVar31._8_4_ * fVar82 + local_fe0 * auVar30._8_4_;
      auVar167._12_4_ =
           fVar81 * auVar246._12_4_ + auVar31._12_4_ * fVar82 + local_fe0 * auVar30._12_4_;
      auVar168._16_4_ =
           fVar81 * auVar246._16_4_ + auVar31._16_4_ * fVar82 + local_fe0 * auVar30._16_4_;
      auVar168._0_16_ = auVar167;
      auVar168._20_4_ =
           fVar81 * auVar246._20_4_ + auVar31._20_4_ * fVar82 + local_fe0 * auVar30._20_4_;
      auVar171._24_4_ =
           fVar81 * auVar246._24_4_ + auVar31._24_4_ * fVar82 + local_fe0 * auVar30._24_4_;
      auVar171._0_24_ = auVar168;
      auVar171._28_4_ = auVar30._28_4_ + auVar31._28_4_ + auVar30._28_4_;
      auVar246 = vsubps_avx(auVar149,auVar116);
      fVar187 = auVar149._0_4_ + auVar116._0_4_;
      fVar188 = auVar149._4_4_ + auVar116._4_4_;
      fVar189 = auVar149._8_4_ + auVar116._8_4_;
      fVar190 = auVar149._12_4_ + auVar116._12_4_;
      fVar191 = auVar149._16_4_ + auVar116._16_4_;
      fVar110 = auVar149._20_4_ + auVar116._20_4_;
      fVar111 = auVar149._24_4_ + auVar116._24_4_;
      auVar116 = vsubps_avx(auVar138,auVar196);
      fVar112 = auVar138._0_4_ + auVar196._0_4_;
      fVar121 = auVar138._4_4_ + auVar196._4_4_;
      fVar123 = auVar138._8_4_ + auVar196._8_4_;
      fVar125 = auVar138._12_4_ + auVar196._12_4_;
      fVar127 = auVar138._16_4_ + auVar196._16_4_;
      fVar129 = auVar138._20_4_ + auVar196._20_4_;
      fVar131 = auVar138._24_4_ + auVar196._24_4_;
      fVar133 = auVar138._28_4_ + auVar196._28_4_;
      auVar196 = vsubps_avx(auVar108,auVar169);
      fVar179 = auVar108._0_4_ + auVar169._0_4_;
      fVar180 = auVar108._4_4_ + auVar169._4_4_;
      fVar181 = auVar108._8_4_ + auVar169._8_4_;
      fVar182 = auVar108._12_4_ + auVar169._12_4_;
      fVar186 = auVar108._16_4_ + auVar169._16_4_;
      fVar141 = auVar108._20_4_ + auVar169._20_4_;
      fVar142 = auVar108._24_4_ + auVar169._24_4_;
      fVar164 = auVar196._0_4_;
      fVar90 = auVar196._4_4_;
      auVar42._4_4_ = fVar121 * fVar90;
      auVar42._0_4_ = fVar112 * fVar164;
      fVar91 = auVar196._8_4_;
      auVar42._8_4_ = fVar123 * fVar91;
      fVar92 = auVar196._12_4_;
      auVar42._12_4_ = fVar125 * fVar92;
      fVar93 = auVar196._16_4_;
      auVar42._16_4_ = fVar127 * fVar93;
      fVar163 = auVar196._20_4_;
      auVar42._20_4_ = fVar129 * fVar163;
      fVar175 = auVar196._24_4_;
      auVar42._24_4_ = fVar131 * fVar175;
      auVar42._28_4_ = fVar89;
      fVar194 = auVar116._0_4_;
      fVar201 = auVar116._4_4_;
      auVar43._4_4_ = fVar201 * fVar180;
      auVar43._0_4_ = fVar194 * fVar179;
      fVar204 = auVar116._8_4_;
      auVar43._8_4_ = fVar204 * fVar181;
      fVar207 = auVar116._12_4_;
      auVar43._12_4_ = fVar207 * fVar182;
      fVar210 = auVar116._16_4_;
      auVar43._16_4_ = fVar210 * fVar186;
      fVar213 = auVar116._20_4_;
      auVar43._20_4_ = fVar213 * fVar141;
      fVar216 = auVar116._24_4_;
      auVar43._24_4_ = fVar216 * fVar142;
      auVar43._28_4_ = fVar159;
      auVar138 = vsubps_avx(auVar43,auVar42);
      fVar177 = auVar246._0_4_;
      fVar178 = auVar246._4_4_;
      auVar44._4_4_ = fVar178 * fVar180;
      auVar44._0_4_ = fVar177 * fVar179;
      fVar179 = auVar246._8_4_;
      auVar44._8_4_ = fVar179 * fVar181;
      fVar180 = auVar246._12_4_;
      auVar44._12_4_ = fVar180 * fVar182;
      fVar181 = auVar246._16_4_;
      auVar44._16_4_ = fVar181 * fVar186;
      fVar182 = auVar246._20_4_;
      auVar44._20_4_ = fVar182 * fVar141;
      fVar186 = auVar246._24_4_;
      auVar44._24_4_ = fVar186 * fVar142;
      auVar44._28_4_ = fVar89 + auVar169._28_4_;
      auVar45._4_4_ = fVar188 * fVar90;
      auVar45._0_4_ = fVar187 * fVar164;
      auVar45._8_4_ = fVar189 * fVar91;
      auVar45._12_4_ = fVar190 * fVar92;
      auVar45._16_4_ = fVar191 * fVar93;
      auVar45._20_4_ = fVar110 * fVar163;
      auVar45._24_4_ = fVar111 * fVar175;
      auVar45._28_4_ = fVar159;
      auVar108 = vsubps_avx(auVar45,auVar44);
      auVar46._4_4_ = fVar201 * fVar188;
      auVar46._0_4_ = fVar194 * fVar187;
      auVar46._8_4_ = fVar204 * fVar189;
      auVar46._12_4_ = fVar207 * fVar190;
      auVar46._16_4_ = fVar210 * fVar191;
      auVar46._20_4_ = fVar213 * fVar110;
      auVar46._24_4_ = fVar216 * fVar111;
      auVar46._28_4_ = auVar149._28_4_ + fVar159;
      auVar47._4_4_ = fVar178 * fVar121;
      auVar47._0_4_ = fVar177 * fVar112;
      auVar47._8_4_ = fVar179 * fVar123;
      auVar47._12_4_ = fVar180 * fVar125;
      auVar47._16_4_ = fVar181 * fVar127;
      auVar47._20_4_ = fVar182 * fVar129;
      auVar47._24_4_ = fVar186 * fVar131;
      auVar47._28_4_ = fVar133;
      auVar116 = vsubps_avx(auVar47,auVar46);
      fStack_fdc = local_fe0;
      fStack_fd8 = local_fe0;
      fStack_fd4 = local_fe0;
      fStack_fd0 = local_fe0;
      fStack_fcc = local_fe0;
      fStack_fc8 = local_fe0;
      fStack_fc4 = local_fe0;
      auVar109._0_4_ =
           fVar81 * auVar138._0_4_ + auVar116._0_4_ * fVar82 + local_fe0 * auVar108._0_4_;
      auVar109._4_4_ =
           fVar81 * auVar138._4_4_ + auVar116._4_4_ * fVar82 + local_fe0 * auVar108._4_4_;
      auVar109._8_4_ =
           fVar81 * auVar138._8_4_ + auVar116._8_4_ * fVar82 + local_fe0 * auVar108._8_4_;
      auVar109._12_4_ =
           fVar81 * auVar138._12_4_ + auVar116._12_4_ * fVar82 + local_fe0 * auVar108._12_4_;
      auVar109._16_4_ =
           fVar81 * auVar138._16_4_ + auVar116._16_4_ * fVar82 + local_fe0 * auVar108._16_4_;
      auVar109._20_4_ =
           fVar81 * auVar138._20_4_ + auVar116._20_4_ * fVar82 + local_fe0 * auVar108._20_4_;
      auVar109._24_4_ =
           fVar81 * auVar138._24_4_ + auVar116._24_4_ * fVar82 + local_fe0 * auVar108._24_4_;
      auVar109._28_4_ = fVar133 + auVar116._28_4_ + fVar133;
      local_1060._0_4_ = auVar109._0_4_ + local_1040._0_4_ + fVar165;
      local_1060._4_4_ = auVar109._4_4_ + local_1040._4_4_ + fVar176;
      local_1060._8_4_ = auVar109._8_4_ + local_1040._8_4_ + auVar167._8_4_;
      local_1060._12_4_ = auVar109._12_4_ + local_1040._12_4_ + auVar167._12_4_;
      local_1060._16_4_ = auVar109._16_4_ + local_1040._16_4_ + auVar168._16_4_;
      local_1060._20_4_ = auVar109._20_4_ + local_1040._20_4_ + auVar168._20_4_;
      local_1060._24_4_ = auVar109._24_4_ + local_1040._24_4_ + auVar171._24_4_;
      local_1060._28_4_ = auVar109._28_4_ + local_1040._28_4_ + auVar171._28_4_;
      auVar138 = vminps_avx(local_1040,auVar171);
      auVar138 = vminps_avx(auVar138,auVar109);
      auVar161._8_4_ = 0x7fffffff;
      auVar161._0_8_ = 0x7fffffff7fffffff;
      auVar161._12_4_ = 0x7fffffff;
      auVar161._16_4_ = 0x7fffffff;
      auVar161._20_4_ = 0x7fffffff;
      auVar161._24_4_ = 0x7fffffff;
      auVar161._28_4_ = 0x7fffffff;
      local_1080 = vandps_avx(auVar161,local_1060);
      fVar89 = local_1080._0_4_ * 1.1920929e-07;
      fVar187 = local_1080._4_4_ * 1.1920929e-07;
      auVar48._4_4_ = fVar187;
      auVar48._0_4_ = fVar89;
      fVar188 = local_1080._8_4_ * 1.1920929e-07;
      auVar48._8_4_ = fVar188;
      fVar189 = local_1080._12_4_ * 1.1920929e-07;
      auVar48._12_4_ = fVar189;
      fVar190 = local_1080._16_4_ * 1.1920929e-07;
      auVar48._16_4_ = fVar190;
      fVar191 = local_1080._20_4_ * 1.1920929e-07;
      auVar48._20_4_ = fVar191;
      fVar110 = local_1080._24_4_ * 1.1920929e-07;
      auVar48._24_4_ = fVar110;
      auVar48._28_4_ = 0x34000000;
      auVar150._0_8_ = CONCAT44(fVar187,fVar89) ^ 0x8000000080000000;
      auVar150._8_4_ = -fVar188;
      auVar150._12_4_ = -fVar189;
      auVar150._16_4_ = -fVar190;
      auVar150._20_4_ = -fVar191;
      auVar150._24_4_ = -fVar110;
      auVar150._28_4_ = 0xb4000000;
      auVar138 = vcmpps_avx(auVar138,auVar150,5);
      auVar116 = vmaxps_avx(local_1040,auVar171);
      auVar108 = vmaxps_avx(auVar116,auVar109);
      auVar108 = vcmpps_avx(auVar108,auVar48,2);
      auVar108 = vorps_avx(auVar138,auVar108);
      if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar108 >> 0x7f,0) == '\0') &&
            (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar108 >> 0xbf,0) == '\0') &&
          (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar108[0x1f]) {
LAB_00f175b9:
        auVar94 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
      }
      else {
        auVar49._4_4_ = fVar220 * fVar104;
        auVar49._0_4_ = fVar217 * fVar103;
        auVar49._8_4_ = fVar221 * fVar105;
        auVar49._12_4_ = fVar222 * fVar26;
        auVar49._16_4_ = fVar223 * fVar27;
        auVar49._20_4_ = fVar224 * fVar28;
        auVar49._24_4_ = fVar225 * fVar29;
        auVar49._28_4_ = auVar138._28_4_;
        auVar94 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
        auStack_13b0 = auVar149._16_16_;
        auVar50._4_4_ = fVar234 * fVar200;
        auVar50._0_4_ = fVar230 * fVar193;
        auVar50._8_4_ = fVar236 * fVar203;
        auVar50._12_4_ = fVar238 * fVar206;
        auVar50._16_4_ = fVar240 * fVar209;
        auVar50._20_4_ = fVar242 * fVar212;
        auVar50._24_4_ = fVar244 * fVar215;
        auVar50._28_4_ = 0x34000000;
        auVar149 = vsubps_avx(auVar50,auVar49);
        auVar51._4_4_ = fVar201 * fVar200;
        auVar51._0_4_ = fVar194 * fVar193;
        auVar51._8_4_ = fVar204 * fVar203;
        auVar51._12_4_ = fVar207 * fVar206;
        auVar51._16_4_ = fVar210 * fVar209;
        auVar51._20_4_ = fVar213 * fVar212;
        auVar51._24_4_ = fVar216 * fVar215;
        auVar51._28_4_ = auVar116._28_4_;
        auVar52._4_4_ = fVar220 * fVar90;
        auVar52._0_4_ = fVar217 * fVar164;
        auVar52._8_4_ = fVar221 * fVar91;
        auVar52._12_4_ = fVar222 * fVar92;
        auVar52._16_4_ = fVar223 * fVar93;
        auVar52._20_4_ = fVar224 * fVar163;
        auVar52._24_4_ = fVar225 * fVar175;
        auVar52._28_4_ = local_1080._28_4_;
        auVar169 = vsubps_avx(auVar52,auVar51);
        auVar138 = vandps_avx(auVar161,auVar49);
        auVar116 = vandps_avx(auVar161,auVar51);
        auVar138 = vcmpps_avx(auVar138,auVar116,1);
        local_1180 = vblendvps_avx(auVar169,auVar149,auVar138);
        auVar53._4_4_ = fVar235 * fVar90;
        auVar53._0_4_ = fVar231 * fVar164;
        auVar53._8_4_ = fVar237 * fVar91;
        auVar53._12_4_ = fVar239 * fVar92;
        auVar53._16_4_ = fVar241 * fVar93;
        auVar53._20_4_ = fVar243 * fVar163;
        auVar53._24_4_ = fVar245 * fVar175;
        auVar53._28_4_ = auVar196._28_4_;
        auVar54._4_4_ = fVar235 * fVar104;
        auVar54._0_4_ = fVar231 * fVar103;
        auVar54._8_4_ = fVar237 * fVar105;
        auVar54._12_4_ = fVar239 * fVar26;
        auVar54._16_4_ = fVar241 * fVar27;
        auVar54._20_4_ = fVar243 * fVar28;
        auVar54._24_4_ = fVar245 * fVar29;
        auVar54._28_4_ = auVar138._28_4_;
        auVar55._4_4_ = fVar199 * fVar200;
        auVar55._0_4_ = fVar192 * fVar193;
        auVar55._8_4_ = fVar202 * fVar203;
        auVar55._12_4_ = fVar205 * fVar206;
        auVar55._16_4_ = fVar208 * fVar209;
        auVar55._20_4_ = fVar211 * fVar212;
        auVar55._24_4_ = fVar214 * fVar215;
        auVar55._28_4_ = auVar149._28_4_;
        auVar149 = vsubps_avx(auVar54,auVar55);
        auVar56._4_4_ = fVar200 * fVar178;
        auVar56._0_4_ = fVar193 * fVar177;
        auVar56._8_4_ = fVar203 * fVar179;
        auVar56._12_4_ = fVar206 * fVar180;
        auVar56._16_4_ = fVar209 * fVar181;
        auVar56._20_4_ = fVar212 * fVar182;
        auVar56._24_4_ = fVar215 * fVar186;
        auVar56._28_4_ = auVar169._28_4_;
        auVar196 = vsubps_avx(auVar56,auVar53);
        auVar138 = vandps_avx(auVar161,auVar55);
        auVar116 = vandps_avx(auVar161,auVar53);
        auVar116 = vcmpps_avx(auVar138,auVar116,1);
        local_1160 = vblendvps_avx(auVar196,auVar149,auVar116);
        auVar57._4_4_ = fVar220 * fVar178;
        auVar57._0_4_ = fVar217 * fVar177;
        auVar57._8_4_ = fVar221 * fVar179;
        auVar57._12_4_ = fVar222 * fVar180;
        auVar57._16_4_ = fVar223 * fVar181;
        auVar57._20_4_ = fVar224 * fVar182;
        auVar57._24_4_ = fVar225 * fVar186;
        auVar57._28_4_ = auVar246._28_4_;
        auVar58._4_4_ = fVar199 * fVar220;
        auVar58._0_4_ = fVar192 * fVar217;
        auVar58._8_4_ = fVar202 * fVar221;
        auVar58._12_4_ = fVar205 * fVar222;
        auVar58._16_4_ = fVar208 * fVar223;
        auVar58._20_4_ = fVar211 * fVar224;
        auVar58._24_4_ = fVar214 * fVar225;
        auVar58._28_4_ = auVar116._28_4_;
        auVar59._4_4_ = fVar235 * fVar234;
        auVar59._0_4_ = fVar231 * fVar230;
        auVar59._8_4_ = fVar237 * fVar236;
        auVar59._12_4_ = fVar239 * fVar238;
        auVar59._16_4_ = fVar241 * fVar240;
        auVar59._20_4_ = fVar243 * fVar242;
        auVar59._24_4_ = fVar245 * fVar244;
        auVar59._28_4_ = auVar149._28_4_;
        auVar60._4_4_ = fVar235 * fVar201;
        auVar60._0_4_ = fVar231 * fVar194;
        auVar60._8_4_ = fVar237 * fVar204;
        auVar60._12_4_ = fVar239 * fVar207;
        auVar60._16_4_ = fVar241 * fVar210;
        auVar60._20_4_ = fVar243 * fVar213;
        auVar60._24_4_ = fVar245 * fVar216;
        auVar60._28_4_ = auVar138._28_4_;
        auVar149 = vsubps_avx(auVar58,auVar59);
        auVar196 = vsubps_avx(auVar60,auVar57);
        auVar138 = vandps_avx(auVar161,auVar59);
        auVar116 = vandps_avx(auVar161,auVar57);
        auVar116 = vcmpps_avx(auVar138,auVar116,1);
        local_1140 = vblendvps_avx(auVar196,auVar149,auVar116);
        auVar106 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
        fVar164 = local_1180._0_4_ * fVar81 +
                  local_1140._0_4_ * fVar82 + local_1160._0_4_ * local_fe0;
        fVar89 = local_1180._4_4_ * fVar81 +
                 local_1140._4_4_ * fVar82 + local_1160._4_4_ * local_fe0;
        fVar103 = local_1180._8_4_ * fVar81 +
                  local_1140._8_4_ * fVar82 + local_1160._8_4_ * local_fe0;
        fVar104 = local_1180._12_4_ * fVar81 +
                  local_1140._12_4_ * fVar82 + local_1160._12_4_ * local_fe0;
        fVar90 = local_1180._16_4_ * fVar81 +
                 local_1140._16_4_ * fVar82 + local_1160._16_4_ * local_fe0;
        fVar105 = local_1180._20_4_ * fVar81 +
                  local_1140._20_4_ * fVar82 + local_1160._20_4_ * local_fe0;
        fVar82 = local_1180._24_4_ * fVar81 +
                 local_1140._24_4_ * fVar82 + local_1160._24_4_ * local_fe0;
        fVar81 = auVar138._28_4_ + auVar138._28_4_ + 0.0;
        auVar99._0_4_ = fVar164 + fVar164;
        auVar99._4_4_ = fVar89 + fVar89;
        auVar99._8_4_ = fVar103 + fVar103;
        auVar99._12_4_ = fVar104 + fVar104;
        auVar99._16_4_ = fVar90 + fVar90;
        auVar99._20_4_ = fVar105 + fVar105;
        auVar99._24_4_ = fVar82 + fVar82;
        auVar99._28_4_ = fVar81 + fVar81;
        fVar164 = local_1180._0_4_ * fVar158 +
                  local_1140._0_4_ * fVar157 + local_1160._0_4_ * fVar156;
        fVar122 = local_1180._4_4_ * fVar122 +
                  local_1140._4_4_ * fVar229 + local_1160._4_4_ * fVar226;
        fVar124 = local_1180._8_4_ * fVar128 +
                  local_1140._8_4_ * fVar126 + local_1160._8_4_ * fVar124;
        fVar126 = local_1180._12_4_ * fVar16 +
                  local_1140._12_4_ * fVar132 + local_1160._12_4_ * fVar130;
        fVar128 = local_1180._16_4_ * fVar19 +
                  local_1140._16_4_ * fVar18 + local_1160._16_4_ * fVar17;
        fVar130 = local_1180._20_4_ * fVar22 +
                  local_1140._20_4_ * fVar21 + local_1160._20_4_ * fVar20;
        fVar132 = local_1180._24_4_ * fVar25 +
                  local_1140._24_4_ * fVar24 + local_1160._24_4_ * fVar23;
        auVar138 = vrcpps_avx(auVar99);
        fVar82 = auVar138._0_4_;
        fVar81 = auVar138._4_4_;
        auVar61._4_4_ = auVar99._4_4_ * fVar81;
        auVar61._0_4_ = auVar99._0_4_ * fVar82;
        fVar156 = auVar138._8_4_;
        auVar61._8_4_ = auVar99._8_4_ * fVar156;
        fVar157 = auVar138._12_4_;
        auVar61._12_4_ = auVar99._12_4_ * fVar157;
        fVar158 = auVar138._16_4_;
        auVar61._16_4_ = auVar99._16_4_ * fVar158;
        fVar226 = auVar138._20_4_;
        auVar61._20_4_ = auVar99._20_4_ * fVar226;
        fVar229 = auVar138._24_4_;
        auVar61._24_4_ = auVar99._24_4_ * fVar229;
        auVar61._28_4_ = local_fc0._28_4_;
        auVar155._8_4_ = 0x3f800000;
        auVar155._0_8_ = 0x3f8000003f800000;
        auVar155._12_4_ = 0x3f800000;
        auVar155._16_4_ = 0x3f800000;
        auVar155._20_4_ = 0x3f800000;
        auVar155._24_4_ = 0x3f800000;
        auVar155._28_4_ = 0x3f800000;
        auVar138 = vsubps_avx(auVar155,auVar61);
        auVar62._4_4_ = (fVar122 + fVar122) * (fVar81 + fVar81 * auVar138._4_4_);
        auVar62._0_4_ = (fVar164 + fVar164) * (fVar82 + fVar82 * auVar138._0_4_);
        auVar62._8_4_ = (fVar124 + fVar124) * (fVar156 + fVar156 * auVar138._8_4_);
        auVar62._12_4_ = (fVar126 + fVar126) * (fVar157 + fVar157 * auVar138._12_4_);
        auVar62._16_4_ = (fVar128 + fVar128) * (fVar158 + fVar158 * auVar138._16_4_);
        auVar62._20_4_ = (fVar130 + fVar130) * (fVar226 + fVar226 * auVar138._20_4_);
        auVar62._24_4_ = (fVar132 + fVar132) * (fVar229 + fVar229 * auVar138._24_4_);
        auVar62._28_4_ = auVar138._28_4_;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar118._4_4_ = uVar3;
        auVar118._0_4_ = uVar3;
        auVar118._8_4_ = uVar3;
        auVar118._12_4_ = uVar3;
        auVar118._16_4_ = uVar3;
        auVar118._20_4_ = uVar3;
        auVar118._24_4_ = uVar3;
        auVar118._28_4_ = uVar3;
        auVar138 = vcmpps_avx(auVar118,auVar62,2);
        auVar95 = vshufps_avx(auVar94,auVar94,0);
        auVar140._16_16_ = auVar95;
        auVar140._0_16_ = auVar95;
        auVar108 = vcmpps_avx(auVar62,auVar140,2);
        auVar138 = vandps_avx(auVar108,auVar138);
        auVar95 = vpackssdw_avx(auVar138._0_16_,auVar138._16_16_);
        auVar106 = vpand_avx(auVar95,auVar106);
        auVar95 = vpmovsxwd_avx(auVar106);
        auVar153 = vpshufd_avx(auVar106,0xee);
        auVar153 = vpmovsxwd_avx(auVar153);
        auVar119._16_16_ = auVar153;
        auVar119._0_16_ = auVar95;
        if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar119 >> 0x7f,0) == '\0') &&
              (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar153 >> 0x3f,0) == '\0') &&
            (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar153[0xf]) goto LAB_00f175b9;
        auVar138 = vcmpps_avx(auVar99,_DAT_01f7b000,4);
        auVar95 = vpackssdw_avx(auVar138._0_16_,auVar138._16_16_);
        auVar106 = vpand_avx(auVar106,auVar95);
        auVar95 = vpmovsxwd_avx(auVar106);
        auVar106 = vpunpckhwd_avx(auVar106,auVar106);
        local_1200._16_16_ = auVar106;
        local_1200._0_16_ = auVar95;
        if ((((((((local_1200 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_1200 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_1200 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_1200 >> 0x7f,0) != '\0') ||
              (local_1200 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar106 >> 0x3f,0) != '\0') ||
            (local_1200 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar106[0xf] < '\0') {
          uVar71 = pGVar12->_geomID;
          uVar69 = pGVar12->_primID;
          local_1280 = local_1040;
          uStack_1478 = auVar167._8_8_;
          uStack_1470 = auVar168._16_8_;
          uStack_1468 = auVar171._24_8_;
          local_1260 = auVar167._0_8_;
          uStack_1258 = uStack_1478;
          uStack_1250 = uStack_1470;
          uStack_1248 = uStack_1468;
          local_1240 = local_1060;
          local_1220 = &local_13d8;
          local_11a0 = auVar62;
          pGVar77 = (context->scene->geometries).items[uVar71].ptr;
          if ((pGVar77->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            auVar153 = *(undefined1 (*) [16])(local_13d8 + local_13d0 * 4);
            auVar94 = auVar153;
            if (2 < local_13c8) {
              auVar94 = *(undefined1 (*) [16])(local_13d8 + local_13d0 * 8);
            }
            auVar138 = vrcpps_avx(local_1060);
            fVar82 = auVar138._0_4_;
            fVar81 = auVar138._4_4_;
            auVar63._4_4_ = local_1060._4_4_ * fVar81;
            auVar63._0_4_ = local_1060._0_4_ * fVar82;
            fVar156 = auVar138._8_4_;
            auVar63._8_4_ = local_1060._8_4_ * fVar156;
            fVar157 = auVar138._12_4_;
            auVar63._12_4_ = local_1060._12_4_ * fVar157;
            fVar158 = auVar138._16_4_;
            auVar63._16_4_ = local_1060._16_4_ * fVar158;
            fVar226 = auVar138._20_4_;
            auVar63._20_4_ = local_1060._20_4_ * fVar226;
            fVar229 = auVar138._24_4_;
            auVar63._24_4_ = local_1060._24_4_ * fVar229;
            auVar63._28_4_ = local_1060._28_4_;
            auVar151._8_4_ = 0x3f800000;
            auVar151._0_8_ = 0x3f8000003f800000;
            auVar151._12_4_ = 0x3f800000;
            auVar151._16_4_ = 0x3f800000;
            auVar151._20_4_ = 0x3f800000;
            auVar151._24_4_ = 0x3f800000;
            auVar151._28_4_ = 0x3f800000;
            auVar108 = vsubps_avx(auVar151,auVar63);
            auVar85._0_4_ = fVar82 + fVar82 * auVar108._0_4_;
            auVar85._4_4_ = fVar81 + fVar81 * auVar108._4_4_;
            auVar85._8_4_ = fVar156 + fVar156 * auVar108._8_4_;
            auVar85._12_4_ = fVar157 + fVar157 * auVar108._12_4_;
            auVar85._16_4_ = fVar158 + fVar158 * auVar108._16_4_;
            auVar85._20_4_ = fVar226 + fVar226 * auVar108._20_4_;
            auVar85._24_4_ = fVar229 + fVar229 * auVar108._24_4_;
            auVar85._28_4_ = auVar138._28_4_ + auVar108._28_4_;
            auVar100._8_4_ = 0x219392ef;
            auVar100._0_8_ = 0x219392ef219392ef;
            auVar100._12_4_ = 0x219392ef;
            auVar100._16_4_ = 0x219392ef;
            auVar100._20_4_ = 0x219392ef;
            auVar100._24_4_ = 0x219392ef;
            auVar100._28_4_ = 0x219392ef;
            auVar138 = vcmpps_avx(local_1080,auVar100,5);
            auVar138 = vandps_avx(auVar138,auVar85);
            auVar64._4_4_ = local_1040._4_4_ * auVar138._4_4_;
            auVar64._0_4_ = local_1040._0_4_ * auVar138._0_4_;
            auVar64._8_4_ = local_1040._8_4_ * auVar138._8_4_;
            auVar64._12_4_ = local_1040._12_4_ * auVar138._12_4_;
            auVar64._16_4_ = local_1040._16_4_ * auVar138._16_4_;
            auVar64._20_4_ = local_1040._20_4_ * auVar138._20_4_;
            auVar64._24_4_ = local_1040._24_4_ * auVar138._24_4_;
            auVar64._28_4_ = auVar85._28_4_;
            auVar108 = vminps_avx(auVar64,auVar151);
            auVar65._4_4_ = auVar138._4_4_ * fVar176;
            auVar65._0_4_ = auVar138._0_4_ * fVar165;
            auVar65._8_4_ = auVar138._8_4_ * auVar167._8_4_;
            auVar65._12_4_ = auVar138._12_4_ * auVar167._12_4_;
            auVar65._16_4_ = auVar138._16_4_ * auVar168._16_4_;
            auVar65._20_4_ = auVar138._20_4_ * auVar168._20_4_;
            auVar65._24_4_ = auVar138._24_4_ * auVar171._24_4_;
            auVar65._28_4_ = auVar138._28_4_;
            auVar138 = vminps_avx(auVar65,auVar151);
            auVar183 = *(undefined1 (*) [16])local_13d8;
            if (local_13d0 == 2) {
              auVar183 = vpshufd_avx(auVar183,0x54);
              auVar153 = vpshufd_avx(auVar153,0x54);
              auVar94 = vpshufd_avx(auVar94,0x54);
            }
            auVar152._16_16_ = auVar153;
            auVar152._0_16_ = auVar183;
            auVar172._16_16_ = auVar94;
            auVar172._0_16_ = auVar153;
            auVar30 = vunpcklps_avx(auVar152,auVar172);
            auVar183 = vpshufd_avx(auVar183,0xa5);
            auVar113 = vpshufd_avx(auVar153,0xa5);
            auVar162._0_16_ = vpsrld_avx(auVar30._0_16_,0x10);
            auVar195 = vpsrld_avx(auVar30._16_16_,0x10);
            auVar162._16_16_ = auVar195;
            auVar198._16_16_ = auVar113;
            auVar198._0_16_ = auVar183;
            auVar153 = vpshufd_avx(auVar153,0x94);
            auVar94 = vpshufd_avx(auVar94,0x94);
            auVar173._0_16_ = vpsrld_avx(auVar183,0x10);
            auVar183 = vpsrld_avx(auVar113,0x10);
            auVar173._16_16_ = auVar183;
            auVar185._16_16_ = auVar94;
            auVar185._0_16_ = auVar153;
            auVar147._0_16_ = vpsrld_avx(auVar153,0x10);
            auVar153 = vpsrld_avx(auVar94,0x10);
            auVar147._16_16_ = auVar153;
            auVar120._8_4_ = 0xffff;
            auVar120._0_8_ = 0xffff0000ffff;
            auVar120._12_4_ = 0xffff;
            auVar120._16_4_ = 0xffff;
            auVar120._20_4_ = 0xffff;
            auVar120._24_4_ = 0xffff;
            auVar120._28_4_ = 0xffff;
            auVar116 = vandps_avx(auVar198,auVar120);
            auVar149 = vcvtdq2ps_avx(auVar116);
            auVar116 = vandps_avx(auVar185,auVar120);
            auVar196 = vcvtdq2ps_avx(auVar116);
            auVar169 = vcvtdq2ps_avx(auVar173);
            auVar246 = vcvtdq2ps_avx(auVar147);
            auVar174._8_4_ = 0x3f800000;
            auVar174._0_8_ = 0x3f8000003f800000;
            auVar174._12_4_ = 0x3f800000;
            auVar174._16_4_ = 0x3f800000;
            auVar174._20_4_ = 0x3f800000;
            auVar174._24_4_ = 0x3f800000;
            auVar174._28_4_ = 0x3f800000;
            auVar116 = vsubps_avx(auVar174,auVar108);
            auVar31 = vsubps_avx(auVar116,auVar138);
            auVar116 = vandps_avx(auVar30,auVar120);
            auVar116 = vcvtdq2ps_avx(auVar116);
            auVar30 = vcvtdq2ps_avx(auVar162);
            local_11e0[0] =
                 auVar196._0_4_ * 0.00012207031 * auVar138._0_4_ +
                 auVar108._0_4_ * auVar149._0_4_ * 0.00012207031 +
                 auVar31._0_4_ * auVar116._0_4_ * 0.00012207031;
            local_11e0[1] =
                 auVar196._4_4_ * 0.00012207031 * auVar138._4_4_ +
                 auVar108._4_4_ * auVar149._4_4_ * 0.00012207031 +
                 auVar31._4_4_ * auVar116._4_4_ * 0.00012207031;
            local_11e0[2] =
                 auVar196._8_4_ * 0.00012207031 * auVar138._8_4_ +
                 auVar108._8_4_ * auVar149._8_4_ * 0.00012207031 +
                 auVar31._8_4_ * auVar116._8_4_ * 0.00012207031;
            local_11e0[3] =
                 auVar196._12_4_ * 0.00012207031 * auVar138._12_4_ +
                 auVar108._12_4_ * auVar149._12_4_ * 0.00012207031 +
                 auVar31._12_4_ * auVar116._12_4_ * 0.00012207031;
            fStack_11d0 = auVar196._16_4_ * 0.00012207031 * auVar138._16_4_ +
                          auVar108._16_4_ * auVar149._16_4_ * 0.00012207031 +
                          auVar31._16_4_ * auVar116._16_4_ * 0.00012207031;
            fStack_11cc = auVar196._20_4_ * 0.00012207031 * auVar138._20_4_ +
                          auVar108._20_4_ * auVar149._20_4_ * 0.00012207031 +
                          auVar31._20_4_ * auVar116._20_4_ * 0.00012207031;
            fStack_11c8 = auVar196._24_4_ * 0.00012207031 * auVar138._24_4_ +
                          auVar108._24_4_ * auVar149._24_4_ * 0.00012207031 +
                          auVar31._24_4_ * auVar116._24_4_ * 0.00012207031;
            fStack_11c4 = auVar196._28_4_ + auVar149._28_4_ + auVar116._28_4_;
            local_11c0[0] =
                 auVar169._0_4_ * 0.00012207031 * auVar108._0_4_ +
                 auVar138._0_4_ * auVar246._0_4_ * 0.00012207031 +
                 auVar31._0_4_ * auVar30._0_4_ * 0.00012207031;
            local_11c0[1] =
                 auVar169._4_4_ * 0.00012207031 * auVar108._4_4_ +
                 auVar138._4_4_ * auVar246._4_4_ * 0.00012207031 +
                 auVar31._4_4_ * auVar30._4_4_ * 0.00012207031;
            local_11c0[2] =
                 auVar169._8_4_ * 0.00012207031 * auVar108._8_4_ +
                 auVar138._8_4_ * auVar246._8_4_ * 0.00012207031 +
                 auVar31._8_4_ * auVar30._8_4_ * 0.00012207031;
            local_11c0[3] =
                 auVar169._12_4_ * 0.00012207031 * auVar108._12_4_ +
                 auVar138._12_4_ * auVar246._12_4_ * 0.00012207031 +
                 auVar31._12_4_ * auVar30._12_4_ * 0.00012207031;
            fStack_11b0 = auVar169._16_4_ * 0.00012207031 * auVar108._16_4_ +
                          auVar138._16_4_ * auVar246._16_4_ * 0.00012207031 +
                          auVar31._16_4_ * auVar30._16_4_ * 0.00012207031;
            fStack_11ac = auVar169._20_4_ * 0.00012207031 * auVar108._20_4_ +
                          auVar138._20_4_ * auVar246._20_4_ * 0.00012207031 +
                          auVar31._20_4_ * auVar30._20_4_ * 0.00012207031;
            fStack_11a8 = auVar169._24_4_ * 0.00012207031 * auVar108._24_4_ +
                          auVar138._24_4_ * auVar246._24_4_ * 0.00012207031 +
                          auVar31._24_4_ * auVar30._24_4_ * 0.00012207031;
            fStack_11a4 = auVar169._28_4_ + auVar246._28_4_ + auVar31._28_4_;
            auVar86._16_16_ = auVar106;
            auVar86._0_16_ = auVar95;
            auVar101._8_4_ = 0x7f800000;
            auVar101._0_8_ = 0x7f8000007f800000;
            auVar101._12_4_ = 0x7f800000;
            auVar101._16_4_ = 0x7f800000;
            auVar101._20_4_ = 0x7f800000;
            auVar101._24_4_ = 0x7f800000;
            auVar101._28_4_ = 0x7f800000;
            auVar138 = vblendvps_avx(auVar101,auVar62,auVar86);
            auVar108 = vshufps_avx(auVar138,auVar138,0xb1);
            auVar108 = vminps_avx(auVar138,auVar108);
            auVar116 = vshufpd_avx(auVar108,auVar108,5);
            auVar108 = vminps_avx(auVar108,auVar116);
            auVar116 = vperm2f128_avx(auVar108,auVar108,1);
            auVar108 = vminps_avx(auVar108,auVar116);
            auVar108 = vcmpps_avx(auVar138,auVar108,0);
            auVar116 = local_1200 & auVar108;
            auVar138 = local_1200;
            if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar116 >> 0x7f,0) != '\0') ||
                  (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar116 >> 0xbf,0) != '\0') ||
                (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar116[0x1f] < '\0') {
              auVar138 = vandps_avx(auVar108,local_1200);
            }
            uVar72 = vmovmskps_avx(auVar138);
            uVar9 = 0;
            if (uVar72 != 0) {
              for (; (uVar72 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar76 = (ulong)uVar9;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar77->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar82 = local_11e0[uVar76];
              fVar81 = local_11c0[uVar76];
              uVar3 = *(undefined4 *)(local_1180 + uVar76 * 4);
              uVar8 = *(undefined4 *)(local_1160 + uVar76 * 4);
              uVar10 = *(undefined4 *)(local_1140 + uVar76 * 4);
              auVar94 = ZEXT416(*(uint *)(local_11a0 + uVar76 * 4));
              *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_11a0 + uVar76 * 4);
              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
              *(float *)(ray + k * 4 + 0xf0) = fVar82;
              *(float *)(ray + k * 4 + 0x100) = fVar81;
              *(uint *)(ray + k * 4 + 0x110) = uVar69;
              *(uint *)(ray + k * 4 + 0x120) = uVar71;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              auVar106 = vpshufd_avx(ZEXT416(uVar71),0);
              _local_1300 = vpshufd_avx(ZEXT416(uVar69),0);
              _auStack_12f0 = auVar146._16_16_;
              _auStack_1310 = auVar117._16_16_;
              _local_1320 = *local_1388;
              auVar88 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
              _auStack_1378 = auVar148._8_24_;
              local_1380 = pGVar77;
              local_12a0 = local_1200;
              local_fc0 = auVar83;
              while( true ) {
                local_10e0 = local_11e0[uVar76];
                local_10d0 = local_11c0[uVar76];
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11a0 + uVar76 * 4);
                local_1350.context = context->user;
                local_1110 = *(undefined4 *)(local_1180 + uVar76 * 4);
                uVar3 = *(undefined4 *)(local_1160 + uVar76 * 4);
                auVar115._4_4_ = uVar3;
                auVar115._0_4_ = uVar3;
                auVar115._8_4_ = uVar3;
                auVar115._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_1140 + uVar76 * 4);
                local_10f0._4_4_ = uVar3;
                local_10f0._0_4_ = uVar3;
                local_10f0._8_4_ = uVar3;
                local_10f0._12_4_ = uVar3;
                uStack_110c = local_1110;
                uStack_1108 = local_1110;
                uStack_1104 = local_1110;
                local_1100 = auVar115;
                fStack_10dc = local_10e0;
                fStack_10d8 = local_10e0;
                fStack_10d4 = local_10e0;
                fStack_10cc = local_10d0;
                fStack_10c8 = local_10d0;
                fStack_10c4 = local_10d0;
                local_10c0 = local_1300;
                uStack_10b8 = uStack_12f8;
                local_10b0 = auVar106;
                vcmpps_avx(ZEXT1632(auVar106),ZEXT1632(auVar106),0xf);
                uStack_109c = (local_1350.context)->instID[0];
                local_10a0 = uStack_109c;
                uStack_1098 = uStack_109c;
                uStack_1094 = uStack_109c;
                uStack_1090 = (local_1350.context)->instPrimID[0];
                uStack_108c = uStack_1090;
                uStack_1088 = uStack_1090;
                uStack_1084 = uStack_1090;
                local_13a0 = _local_1320;
                local_1350.valid = (int *)local_13a0;
                local_1350.geometryUserPtr = pGVar77->userPtr;
                local_1350.hit = (RTCHitN *)&local_1110;
                local_1350.N = 4;
                local_13c0 = auVar88._0_16_;
                local_1350.ray = (RTCRayN *)ray;
                if (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar77->intersectionFilterN)(&local_1350);
                  auVar88 = ZEXT1664(local_13c0);
                  pGVar77 = local_1380;
                }
                if (local_13a0 == (undefined1  [16])0x0) {
                  auVar95 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar95 = auVar95 ^ _DAT_01f46b70;
                }
                else {
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar77->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var13)(&local_1350);
                    auVar88 = ZEXT1664(local_13c0);
                    pGVar77 = local_1380;
                  }
                  auVar153 = vpcmpeqd_avx(local_13a0,_DAT_01f45a50);
                  auVar94 = vpcmpeqd_avx(auVar115,auVar115);
                  auVar95 = auVar153 ^ auVar94;
                  if (local_13a0 != (undefined1  [16])0x0) {
                    auVar153 = auVar153 ^ auVar94;
                    auVar94 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])local_1350.hit);
                    *(undefined1 (*) [16])(local_1350.ray + 0xc0) = auVar94;
                    auVar94 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(local_1350.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_1350.ray + 0xd0) = auVar94;
                    auVar94 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(local_1350.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_1350.ray + 0xe0) = auVar94;
                    auVar94 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(local_1350.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_1350.ray + 0xf0) = auVar94;
                    auVar94 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(local_1350.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_1350.ray + 0x100) = auVar94;
                    auVar94 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(local_1350.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_1350.ray + 0x110) = auVar94;
                    auVar94 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(local_1350.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_1350.ray + 0x120) = auVar94;
                    auVar94 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(local_1350.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_1350.ray + 0x130) = auVar94;
                    auVar153 = vmaskmovps_avx(auVar153,*(undefined1 (*) [16])(local_1350.hit + 0x80)
                                             );
                    *(undefined1 (*) [16])(local_1350.ray + 0x140) = auVar153;
                  }
                }
                auVar97._8_8_ = 0x100000001;
                auVar97._0_8_ = 0x100000001;
                if ((auVar97 & auVar95) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = auVar88._0_4_;
                }
                else {
                  auVar88 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_12a0 + uVar76 * 4) = 0;
                auVar94 = auVar88._0_16_;
                auVar95 = vshufps_avx(auVar94,auVar94,0);
                auVar87._16_16_ = auVar95;
                auVar87._0_16_ = auVar95;
                auVar108 = vcmpps_avx(auVar62,auVar87,2);
                auVar138 = vandps_avx(auVar108,local_12a0);
                local_12a0 = local_12a0 & auVar108;
                if ((((((((local_12a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_12a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_12a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_12a0 >> 0x7f,0) == '\0') &&
                      (local_12a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_12a0 >> 0xbf,0) == '\0') &&
                    (local_12a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_12a0[0x1f]) break;
                auVar102._8_4_ = 0x7f800000;
                auVar102._0_8_ = 0x7f8000007f800000;
                auVar102._12_4_ = 0x7f800000;
                auVar102._16_4_ = 0x7f800000;
                auVar102._20_4_ = 0x7f800000;
                auVar102._24_4_ = 0x7f800000;
                auVar102._28_4_ = 0x7f800000;
                auVar108 = vblendvps_avx(auVar102,auVar62,auVar138);
                auVar116 = vshufps_avx(auVar108,auVar108,0xb1);
                auVar116 = vminps_avx(auVar108,auVar116);
                auVar146 = vshufpd_avx(auVar116,auVar116,5);
                auVar116 = vminps_avx(auVar116,auVar146);
                auVar146 = vperm2f128_avx(auVar116,auVar116,1);
                auVar116 = vminps_avx(auVar116,auVar146);
                auVar116 = vcmpps_avx(auVar108,auVar116,0);
                auVar146 = auVar138 & auVar116;
                auVar108 = auVar138;
                if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar146 >> 0x7f,0) != '\0') ||
                      (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar146 >> 0xbf,0) != '\0') ||
                    (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar146[0x1f] < '\0') {
                  auVar108 = vandps_avx(auVar116,auVar138);
                }
                uVar69 = vmovmskps_avx(auVar108);
                uVar71 = 0;
                if (uVar69 != 0) {
                  for (; (uVar69 >> uVar71 & 1) == 0; uVar71 = uVar71 + 1) {
                  }
                }
                uVar76 = (ulong)uVar71;
                local_12a0 = auVar138;
              }
            }
          }
        }
      }
      auVar106 = vshufps_avx(auVar94,auVar94,0);
      auVar88 = ZEXT1664(auVar106);
      goto LAB_00f161b7;
    }
    sVar14 = ((*(GridSOA **)(uVar76 & 0xfffffffffffffff0))->troot).ptr;
    (pre->super_Precalculations).grid = *(GridSOA **)(uVar76 & 0xfffffffffffffff0);
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar88 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
    if (sVar14 != 0) {
      *(size_t *)*pauVar80 = sVar14;
      *(undefined4 *)(*pauVar80 + 8) = 0;
      pauVar80 = pauVar80 + 1;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }